

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# changesoplex.hpp
# Opt level: O0

void __thiscall
soplex::SPxSolverBase<double>::changeRange
          (SPxSolverBase<double> *this,VectorBase<double> *newLhs,VectorBase<double> *newRhs,
          bool scale)

{
  SPxStatus SVar1;
  double *pdVar2;
  undefined8 in_RSI;
  SPxSolverBase<double> *in_RDI;
  SPxLPBase<double> *unaff_retaddr;
  int i;
  int in_stack_ffffffffffffffcc;
  uint uVar3;
  uint in_stack_ffffffffffffffd4;
  uint local_20;
  undefined1 scale_00;
  SPxSolverBase<double> *newLhs_00;
  
  scale_00 = (undefined1)((ulong)in_RSI >> 0x38);
  newLhs_00 = in_RDI;
  forceRecompNonbasicValue(in_RDI);
  SPxLPBase<double>::changeLhs(unaff_retaddr,(VectorBase<double> *)newLhs_00,(bool)scale_00);
  SPxLPBase<double>::changeRhs(unaff_retaddr,(VectorBase<double> *)newLhs_00,(bool)scale_00);
  SVar1 = SPxBasisBase<double>::status(&in_RDI->super_SPxBasisBase<double>);
  if (NO_PROBLEM < SVar1) {
    local_20 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x20867e);
    while (local_20 = local_20 - 1, -1 < (int)local_20) {
      uVar3 = local_20;
      pdVar2 = SPxLPBase<double>::lhs
                         ((SPxLPBase<double> *)CONCAT44(in_stack_ffffffffffffffd4,local_20),
                          in_stack_ffffffffffffffcc);
      (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x6b])
                (*pdVar2,0,in_RDI,(ulong)uVar3);
      in_stack_ffffffffffffffd4 = local_20;
      pdVar2 = SPxLPBase<double>::rhs
                         ((SPxLPBase<double> *)CONCAT44(local_20,uVar3),in_stack_ffffffffffffffcc);
      (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x6c])
                (*pdVar2,in_RDI,(ulong)in_stack_ffffffffffffffd4);
    }
    (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x77])();
  }
  return;
}

Assistant:

void SPxSolverBase<R>::changeRange(const VectorBase<R>& newLhs, const VectorBase<R>& newRhs,
                                   bool scale)
{
   // we better recompute the nonbasic value when changing all ranges
   forceRecompNonbasicValue();

   SPxLPBase<R>::changeLhs(newLhs, scale);
   SPxLPBase<R>::changeRhs(newRhs, scale);

   if(SPxBasisBase<R>::status() > SPxBasisBase<R>::NO_PROBLEM)
   {
      for(int i = this->nRows() - 1; i >= 0; --i)
      {
         changeLhsStatus(i, this->lhs(i));
         changeRhsStatus(i, this->rhs(i));
      }

      unInit();
   }
}